

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_addi_i64_x86_64(TCGContext *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1,int64_t arg2)

{
  TCGv_i64 arg2_00;
  uintptr_t o;
  
  if (arg2 != 0) {
    arg2_00 = tcg_const_i64_x86_64(tcg_ctx,arg2);
    tcg_gen_add_i64(tcg_ctx,ret,arg1,arg2_00);
    tcg_temp_free_internal_x86_64(tcg_ctx,(TCGTemp *)(arg2_00 + (long)tcg_ctx));
    return;
  }
  tcg_gen_mov_i64_x86_64(tcg_ctx,ret,arg1);
  return;
}

Assistant:

void tcg_gen_addi_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg1, int64_t arg2)
{
    /* some cases can be optimized here */
    if (arg2 == 0) {
        tcg_gen_mov_i64(tcg_ctx, ret, arg1);
    } else {
        TCGv_i64 t0 = tcg_const_i64(tcg_ctx, arg2);
        tcg_gen_add_i64(tcg_ctx, ret, arg1, t0);
        tcg_temp_free_i64(tcg_ctx, t0);
    }
}